

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O0

int lws_mqtt_client_send_subcribe(lws *wsi,lws_mqtt_subscribe_param_t *sub)

{
  uint32_t uVar1;
  char *src;
  int iVar2;
  int iVar3;
  uint8_t *p_00;
  lws *wsi_00;
  uchar *puVar4;
  lws_mqtt_subs_t *plVar5;
  size_t sVar6;
  uint8_t *puVar7;
  uint16_t uVar8;
  uint local_78;
  uint32_t tops;
  uint32_t n;
  uint32_t rem_len;
  lws_mqtt_subs_t *mysub;
  char local_60 [7];
  uint8_t extant;
  uint8_t exists [8];
  lws_mqtt_str_t mqtt_vh_payload;
  lws *nwsi;
  uint8_t *p;
  uint8_t *start;
  uint8_t *b;
  lws_context_per_thread *pt;
  lws_mqtt_subscribe_param_t *sub_local;
  lws *wsi_local;
  
  puVar4 = wsi->context->pt[(int)wsi->tsi].serv_buf;
  p_00 = puVar4 + 0x10;
  wsi_00 = lws_get_network_wsi(wsi);
  if (sub->num_topics == 0) {
    __assert_fail("sub->num_topics",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/mqtt.c"
                  ,0x6ed,
                  "int lws_mqtt_client_send_subcribe(struct lws *, lws_mqtt_subscribe_param_t *)");
  }
  if (7 < sub->num_topics) {
    __assert_fail("sub->num_topics < sizeof(exists)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dmikushin[P]libwebsockets/lib/roles/mqtt/mqtt.c"
                  ,0x6ee,
                  "int lws_mqtt_client_send_subcribe(struct lws *, lws_mqtt_subscribe_param_t *)");
  }
  if ((short)wsi->wsistate == 0x119) {
    puVar4 = puVar4 + 0x11;
    iVar2 = lws_mqtt_fill_fixed_header(p_00,LMQCP_CTOS_SUBSCRIBE,'\0',QOS0,'\0');
    if (iVar2 == 0) {
      mysub._7_1_ = 0;
      memset(local_60,0,8);
      for (local_78 = 0; local_78 < sub->num_topics; local_78 = local_78 + 1) {
        plVar5 = lws_mqtt_find_sub(wsi_00->mqtt,sub->topic[local_78].name);
        if ((plVar5 != (lws_mqtt_subs_t *)0x0) && (plVar5->ref_count != '\0')) {
          plVar5->ref_count = plVar5->ref_count + '\x01';
          local_60[local_78] = '\x01';
          mysub._7_1_ = mysub._7_1_ + 1;
        }
        plVar5 = lws_mqtt_create_sub(wsi->mqtt,sub->topic[local_78].name);
        if (plVar5 == (lws_mqtt_subs_t *)0x0) {
          _lws_log(1,"%s: create sub fail\n","lws_mqtt_client_send_subcribe");
          return 1;
        }
      }
      if ((uint)mysub._7_1_ == sub->num_topics) {
        _lws_log(4,"%s: all topics already subscribed\n","lws_mqtt_client_send_subcribe");
        iVar2 = user_callback_handle_rxflow
                          (wsi->protocol->callback,wsi,LWS_CALLBACK_MQTT_SUBSCRIBED,wsi->user_space,
                           (void *)0x0,0);
        if (iVar2 < 0) {
          _lws_log(1,"%s: MQTT_SUBSCRIBE failed\n","lws_mqtt_client_send_subcribe");
          wsi_local._4_4_ = -1;
        }
        else {
          wsi_local._4_4_ = 0;
        }
      }
      else {
        uVar1 = sub->num_topics;
        tops = 2;
        for (local_78 = 0; local_78 < sub->num_topics; local_78 = local_78 + 1) {
          if (local_60[local_78] == '\0') {
            sVar6 = strlen(sub->topic[local_78].name);
            tops = tops + (int)sVar6 + 3;
          }
        }
        wsi->mqtt->sub_size = (uint16_t)tops;
        _lws_log(0x10,"%s: Number of topics = %d, Remaining len = %d\n",
                 "lws_mqtt_client_send_subcribe",(ulong)(uVar1 - mysub._7_1_),(ulong)tops);
        iVar3 = lws_mqtt_vbi_encode(tops,puVar4);
        iVar2 = (int)p_00;
        if (tops + ((int)(puVar4 + iVar3) - iVar2) < wsi->context->pt_serv_buf_size) {
          lws_mqtt_str_init((lws_mqtt_str_t *)exists,puVar4 + iVar3,(uint16_t)tops,'\0');
          puVar7 = lws_mqtt_str_next((lws_mqtt_str_t *)exists,(uint16_t *)0x0);
          uVar8 = wsi->mqtt->pkt_id + 1;
          wsi->mqtt->pkt_id = uVar8;
          wsi->mqtt->ack_pkt_id = uVar8;
          lws_ser_wu16be(puVar7,wsi->mqtt->ack_pkt_id);
          iVar3 = lws_mqtt_str_advance((lws_mqtt_str_t *)exists,2);
          if (iVar3 == 0) {
            nwsi = (lws *)lws_mqtt_str_next((lws_mqtt_str_t *)exists,(uint16_t *)0x0);
            for (local_78 = 0; local_78 < sub->num_topics; local_78 = local_78 + 1) {
              _lws_log(8,"%s: topics[%d] = %s\n","lws_mqtt_client_send_subcribe",(ulong)local_78,
                       sub->topic[local_78].name);
              if (local_60[local_78] == '\0') {
                plVar5 = lws_mqtt_create_sub(wsi_00->mqtt,sub->topic[local_78].name);
                if (plVar5 == (lws_mqtt_subs_t *)0x0) {
                  return 1;
                }
                sVar6 = strlen(sub->topic[local_78].name);
                lws_ser_wu16be((uint8_t *)nwsi,(uint16_t)sVar6);
                iVar3 = lws_mqtt_str_advance((lws_mqtt_str_t *)exists,2);
                if (iVar3 != 0) {
                  return 1;
                }
                puVar7 = lws_mqtt_str_next((lws_mqtt_str_t *)exists,(uint16_t *)0x0);
                src = sub->topic[local_78].name;
                sVar6 = strlen(sub->topic[local_78].name);
                lws_strncpy((char *)puVar7,src,sVar6 + 1);
                sVar6 = strlen(sub->topic[local_78].name);
                iVar3 = lws_mqtt_str_advance((lws_mqtt_str_t *)exists,(int)sVar6);
                if (iVar3 != 0) {
                  return 1;
                }
                puVar7 = lws_mqtt_str_next((lws_mqtt_str_t *)exists,(uint16_t *)0x0);
                *puVar7 = (uint8_t)sub->topic[local_78].qos;
                iVar3 = lws_mqtt_str_advance((lws_mqtt_str_t *)exists,1);
                if (iVar3 != 0) {
                  return 1;
                }
                nwsi = (lws *)lws_mqtt_str_next((lws_mqtt_str_t *)exists,(uint16_t *)0x0);
              }
            }
            iVar3 = lws_write(wsi_00,p_00,(long)((int)nwsi - iVar2),LWS_WRITE_BINARY);
            if (iVar3 == (int)nwsi - iVar2) {
              wsi->mqtt->field_0xfe = wsi->mqtt->field_0xfe & 0xf7 | 8;
              wsi_local._4_4_ = 0;
            }
            else {
              wsi_local._4_4_ = 1;
            }
          }
          else {
            wsi_local._4_4_ = 1;
          }
        }
        else {
          _lws_log(1,"%s: Payload is too big\n","lws_mqtt_client_send_subcribe");
          wsi_local._4_4_ = 1;
        }
      }
    }
    else {
      _lws_log(1,"%s: Failed to fill fixed header\n","lws_mqtt_client_send_subcribe");
      wsi_local._4_4_ = 1;
    }
  }
  else {
    wsi_local._4_4_ = 1;
  }
  return wsi_local._4_4_;
}

Assistant:

int
lws_mqtt_client_send_subcribe(struct lws *wsi, lws_mqtt_subscribe_param_t *sub)
{
	struct lws_context_per_thread *pt = &wsi->context->pt[(int)wsi->tsi];
	uint8_t *b = (uint8_t *)pt->serv_buf + LWS_PRE, *start = b, *p = start;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	lws_mqtt_str_t mqtt_vh_payload;
	uint8_t exists[8], extant;
	lws_mqtt_subs_t *mysub;
	uint32_t rem_len, n;
	uint32_t __attribute__((unused)) tops;

	assert(sub->num_topics);
	assert(sub->num_topics < sizeof(exists));

	switch (lwsi_state(wsi)) {
	case LRS_ESTABLISHED: /* Protocol connection established */
		if (lws_mqtt_fill_fixed_header(p++, LMQCP_CTOS_SUBSCRIBE,
					       0, 0, 0)) {
			lwsl_err("%s: Failed to fill fixed header\n", __func__);
			return 1;
		}

		/*
		 * The stream wants to subscribe to one or more topic, but
		 * the shared nwsi may already be subscribed to some or all of
		 * them from interactions with other streams.  For those cases,
		 * we filter them from the list the child wants until we just
		 * have ones that are new to the nwsi.  If nothing left, we just
		 * synthesize the callback to the child as if SUBACK had come
		 * and we're done, otherwise just ask the server for topics that
		 * are new to the wsi.
		 */

		extant = 0;
		memset(&exists, 0, sizeof(exists));
		for (n = 0; n < sub->num_topics; n++) {
			mysub = lws_mqtt_find_sub(nwsi->mqtt, sub->topic[n].name);
			if (mysub && mysub->ref_count) {
				mysub->ref_count++; /* another stream using it */
				exists[n] = 1;
				extant++;
			}

			/*
			 * Attach the topic we're subscribing to, to wsi->mqtt
			 */
			if (!lws_mqtt_create_sub(wsi->mqtt, sub->topic[n].name)) {
				lwsl_err("%s: create sub fail\n", __func__);
				return 1;
			}
		}

		if (extant == sub->num_topics) {
			/*
			 * It turns out there's nothing to do here, the nwsi has
			 * already subscribed to all the topics this stream
			 * wanted.  Just tell it it can have them.
			 */
			lwsl_notice("%s: all topics already subscribed\n", __func__);
			if (user_callback_handle_rxflow(
				    wsi->protocol->callback,
				    wsi, LWS_CALLBACK_MQTT_SUBSCRIBED,
				    wsi->user_space, NULL, 0) < 0) {
				lwsl_err("%s: MQTT_SUBSCRIBE failed\n",
					 __func__);
				return -1;
			}

			return 0;
		}

		/*
		 * zero or more of the topics already existed, but not all,
		 * so we must go to the server with a filtered list of the
		 * new ones only
		 */

		tops = sub->num_topics - extant;

		/*
		 * Pid + (Topic len field + Topic len + Req. QoS) x Num of Topics
		 */
		rem_len = 2;
		for (n = 0; n < sub->num_topics; n++)
			if (!exists[n])
				rem_len += (2 + strlen(sub->topic[n].name) + 1);

		wsi->mqtt->sub_size = rem_len;

		lwsl_debug("%s: Number of topics = %d, Remaining len = %d\n",
			   __func__, (int)tops, (int)rem_len);

		p += lws_mqtt_vbi_encode(rem_len, p);

		if ((rem_len + lws_ptr_diff(p, start)) >=
					       wsi->context->pt_serv_buf_size) {
			lwsl_err("%s: Payload is too big\n", __func__);
			return 1;
		}

		/* Init lws_mqtt_str */
		lws_mqtt_str_init(&mqtt_vh_payload, (uint8_t *)p, rem_len, 0);
		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

		/* Packet ID */
		wsi->mqtt->ack_pkt_id = ++wsi->mqtt->pkt_id;
		lws_ser_wu16be(p, wsi->mqtt->ack_pkt_id);

		if (lws_mqtt_str_advance(&mqtt_vh_payload, 2))
			return 1;

		p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

		for (n = 0; n < sub->num_topics; n++) {
			lwsl_info("%s: topics[%d] = %s\n", __func__,
				   (int)n, sub->topic[n].name);

			/* if the nwsi already has it, don't ask server for it */
			if (exists[n])
				continue;

			/*
			 * Attach the topic we're subscribing to, to nwsi->mqtt
			 * so we know the nwsi itself has a subscription to it
			 */

			if (!lws_mqtt_create_sub(nwsi->mqtt, sub->topic[n].name))
				return 1;

			/* Topic's Len */
			lws_ser_wu16be(p, strlen(sub->topic[n].name));
			if (lws_mqtt_str_advance(&mqtt_vh_payload, 2))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

			/* Topic Name */
			lws_strncpy((char *)p, sub->topic[n].name,
				    strlen(sub->topic[n].name) + 1);
			if (lws_mqtt_str_advance(&mqtt_vh_payload,
						 strlen(sub->topic[n].name)))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);

			/* QoS */
			*p = sub->topic[n].qos;
			if (lws_mqtt_str_advance(&mqtt_vh_payload, 1))
				return 1;
			p = lws_mqtt_str_next(&mqtt_vh_payload, NULL);
		}
		break;

	default:
		return 1;
	}

	if (lws_write(nwsi, start, lws_ptr_diff(p, start), LWS_WRITE_BINARY) !=
					lws_ptr_diff(p, start))
		return 1;

	wsi->mqtt->inside_subscribe = 1;

	return 0;
}